

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  int iVar2;
  uint uVar3;
  stbi_uc *psVar4;
  byte *pbVar5;
  byte bVar6;
  
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_00116b5b;
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar2;
    }
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'G') goto LAB_00116b5b;
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_00116b5b;
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar2;
    }
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'I') goto LAB_00116b5b;
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_00116b5b;
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar2;
    }
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'F') goto LAB_00116b5b;
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_00116b5b;
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar2;
    }
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != '8') goto LAB_00116b5b;
  psVar4 = s->img_buffer;
  if (psVar4 < s->img_buffer_end) {
LAB_00116a4a:
    s->img_buffer = psVar4 + 1;
    sVar1 = *psVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar4 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar4;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar4;
        s->img_buffer_end = psVar4 + iVar2;
      }
      psVar4 = s->img_buffer;
      goto LAB_00116a4a;
    }
    sVar1 = '\0';
  }
  if ((sVar1 != '7') && (sVar1 != '9')) {
LAB_00116b5b:
    stbi__g_failure_reason = "not GIF";
    return 0;
  }
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_00116b5b;
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar2;
    }
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'a') goto LAB_00116b5b;
  stbi__g_failure_reason = "";
  iVar2 = stbi__get16le(s);
  g->w = iVar2;
  iVar2 = stbi__get16le(s);
  g->h = iVar2;
  pbVar5 = s->img_buffer;
  if (pbVar5 < s->img_buffer_end) {
LAB_00116b91:
    s->img_buffer = pbVar5 + 1;
    uVar3 = (uint)*pbVar5;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar4 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar4;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar4;
        s->img_buffer_end = psVar4 + iVar2;
      }
      pbVar5 = s->img_buffer;
      goto LAB_00116b91;
    }
    uVar3 = 0;
  }
  g->flags = uVar3;
  pbVar5 = s->img_buffer;
  if (pbVar5 < s->img_buffer_end) {
LAB_00116c0f:
    s->img_buffer = pbVar5 + 1;
    uVar3 = (uint)*pbVar5;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar4 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar4;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar4;
        s->img_buffer_end = psVar4 + iVar2;
      }
      pbVar5 = s->img_buffer;
      goto LAB_00116c0f;
    }
    uVar3 = 0;
  }
  g->bgindex = uVar3;
  pbVar5 = s->img_buffer;
  if (s->img_buffer_end <= pbVar5) {
    if (s->read_from_callbacks == 0) {
      uVar3 = 0;
      goto LAB_00116c9b;
    }
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar2;
    }
    pbVar5 = s->img_buffer;
  }
  s->img_buffer = pbVar5 + 1;
  uVar3 = (uint)*pbVar5;
LAB_00116c9b:
  g->ratio = uVar3;
  g->transparent = -1;
  if (comp != (int *)0x0) {
    *comp = 4;
  }
  if (is_info != 0) {
    return 1;
  }
  bVar6 = (byte)g->flags;
  if (-1 < (char)bVar6) {
    return 1;
  }
  stbi__gif_parse_colortable(s,g->pal,2 << (bVar6 & 7),-1);
  return 1;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
    stbi_uc version;
    if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
        return stbi__err("not GIF", "Corrupt GIF");

    version = stbi__get8(s);
    if (version != '7' && version != '9') return stbi__err("not GIF", "Corrupt GIF");
    if (stbi__get8(s) != 'a') return stbi__err("not GIF", "Corrupt GIF");

    stbi__g_failure_reason = "";
    g->w = stbi__get16le(s);
    g->h = stbi__get16le(s);
    g->flags = stbi__get8(s);
    g->bgindex = stbi__get8(s);
    g->ratio = stbi__get8(s);
    g->transparent = -1;

    if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

    if (is_info) return 1;

    if (g->flags & 0x80)
        stbi__gif_parse_colortable(s, g->pal, 2 << (g->flags & 7), -1);

    return 1;
}